

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O3

bool duckdb::ExtensionTypeInfo::Equals
               (optional_ptr<duckdb::ExtensionTypeInfo,_true> lhs,
               optional_ptr<duckdb::ExtensionTypeInfo,_true> rhs)

{
  bool bVar1;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> this;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> this_00;
  bool bVar2;
  ulong uVar3;
  const_reference this_01;
  const_reference rhs_00;
  const_iterator cVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  ExtensionTypeInfo *in_RSI;
  ExtensionTypeInfo *in_RDI;
  size_type __n;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> local_40;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> local_38;
  
  if (((in_RSI != (ExtensionTypeInfo *)0x0) && (in_RDI != (ExtensionTypeInfo *)0x0)) &&
     (in_RDI != in_RSI)) {
    local_40.ptr = in_RSI;
    local_38.ptr = in_RDI;
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_38);
    this_00.ptr = local_38.ptr;
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_40);
    this.ptr = local_40.ptr;
    uVar3 = ((long)((this_00.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)((this_00.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    uVar5 = ((long)((local_40.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)((local_40.ptr)->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    if (uVar5 != 0) {
      __n = 0;
      do {
        this_01 = vector<duckdb::LogicalTypeModifier,_true>::operator[]
                            (&(this_00.ptr)->modifiers,__n);
        rhs_00 = vector<duckdb::LogicalTypeModifier,_true>::operator[](&(this.ptr)->modifiers,__n);
        if ((this_01->value).type_.id_ != (rhs_00->value).type_.id_) {
          return false;
        }
        bVar2 = LogicalType::EqualTypeInfo((LogicalType *)this_01,(LogicalType *)rhs_00);
        if (!bVar2) {
          return false;
        }
        bVar2 = (this_01->value).is_null;
        bVar1 = (rhs_00->value).is_null;
        if ((bVar2 != true) || ((bVar1 & 1U) == 0)) {
          if (bVar2 != bVar1) {
            return false;
          }
          bVar2 = Value::operator!=(&this_01->value,&rhs_00->value);
          if (bVar2) {
            return false;
          }
        }
        __n = __n + 1;
      } while (uVar5 != __n);
    }
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_38);
    optional_ptr<duckdb::ExtensionTypeInfo,_true>::CheckValid(&local_40);
    p_Var6 = ((local_38.ptr)->properties)._M_h._M_before_begin._M_nxt;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      do {
        cVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&((local_40.ptr)->properties)._M_h,(key_type *)(p_Var6 + 1));
        if ((cVar4.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             ._M_cur != (__node_type *)0x0) &&
           (bVar2 = Value::operator!=((Value *)(p_Var6 + 5),
                                      (Value *)((long)cVar4.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                                  ._M_cur + 0x28)), bVar2)) {
          return false;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while (p_Var6 != (_Hash_node_base *)0x0);
    }
  }
  return true;
}

Assistant:

bool ExtensionTypeInfo::Equals(optional_ptr<ExtensionTypeInfo> lhs, optional_ptr<ExtensionTypeInfo> rhs) {
	// Either both are null, or both are the same, so they are equal
	if (lhs.get() == rhs.get()) {
		return true;
	}
	// If one is null, then we cant compare them
	if (lhs == nullptr || rhs == nullptr) {
		return true;
	}

	// Both are not null, so we can compare them
	D_ASSERT(lhs != nullptr && rhs != nullptr);

	// Compare modifiers
	const auto &lhs_mods = lhs->modifiers;
	const auto &rhs_mods = rhs->modifiers;
	const auto common_mods = MinValue(lhs_mods.size(), rhs_mods.size());
	for (idx_t i = 0; i < common_mods; i++) {
		// If the types are not strictly equal, they are not equal
		auto &lhs_val = lhs_mods[i].value;
		auto &rhs_val = rhs_mods[i].value;

		if (lhs_val.type() != rhs_val.type()) {
			return false;
		}

		// If both are null, its fine
		if (lhs_val.IsNull() && rhs_val.IsNull()) {
			continue;
		}

		// If one is null, the other must be null too
		if (lhs_val.IsNull() != rhs_val.IsNull()) {
			return false;
		}

		if (lhs_val != rhs_val) {
			return false;
		}
	}

	// Properties are optional, so only compare those present in both
	const auto &lhs_props = lhs->properties;
	const auto &rhs_props = rhs->properties;

	for (const auto &kv : lhs_props) {
		auto it = rhs_props.find(kv.first);
		if (it == rhs_props.end()) {
			// Continue
			continue;
		}
		if (kv.second != it->second) {
			// Mismatch!
			return false;
		}
	}

	// All ok!
	return true;
}